

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::UniformCase::compareUniformValues
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  DataType DVar1;
  pointer pVVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  pointer pVVar6;
  long lVar7;
  pointer pBVar8;
  long lVar9;
  pointer pBVar10;
  float fVar11;
  float fVar12;
  bool local_1cc;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  pBVar10 = (basicUniforms->
            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(basicUniforms->
                          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10) >> 3) *
      0x286bca1b < 1) {
    local_1cc = true;
  }
  else {
    local_1cc = true;
    lVar5 = 0x2c;
    lVar7 = 4;
    lVar9 = 0;
    do {
      pVVar2 = (values->
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (undefined1  [8])this;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"// Checking uniform ",0x14);
      pBVar8 = pBVar10 + lVar9;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pBVar8->name)._M_dataplus._M_p,
                 (pBVar8->name)._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pVVar6 = pVVar2 + lVar9;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (pVVar6->type != TYPE_INVALID) {
        uVar3 = glu::getDataTypeScalarSize(pVVar6->type);
        DVar1 = pVVar6->type;
        if ((DVar1 - TYPE_FLOAT < 4) ||
           (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9)) {
          if (0 < (int)uVar3) {
            uVar4 = 0;
            do {
              fVar11 = *(float *)((long)&pVVar2->type + uVar4 * 4 + lVar7) -
                       *(float *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar4 * 4 + lVar5);
              fVar12 = -fVar11;
              if (-fVar11 <= fVar11) {
                fVar12 = fVar11;
              }
              if (0.05 <= fVar12) goto LAB_00f768df;
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
        }
        else if (DVar1 - TYPE_INT < 4) {
          if (0 < (int)uVar3) {
            uVar4 = 0;
            do {
              if (*(int *)((long)&pVVar2->type + uVar4 * 4 + lVar7) !=
                  *(int *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar4 * 4 + lVar5))
              goto LAB_00f768df;
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
        }
        else if (DVar1 - TYPE_BOOL < 4) {
          if (0 < (int)uVar3) {
            uVar4 = 0;
            do {
              if (*(char *)((long)&pVVar2->type + uVar4 + lVar7) !=
                  *(char *)((long)&(pBVar10->name)._M_dataplus._M_p + uVar4 + lVar5))
              goto LAB_00f768df;
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
        }
        else if ((DVar1 - TYPE_SAMPLER_1D < 0x1e) &&
                ((pVVar6->val).intV[0] != (pBVar8->finalValue).val.intV[0])) {
LAB_00f768df:
          local_1b0 = (undefined1  [8])this;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "// FAILURE: value obtained with glGetUniform*() for uniform ",0x3c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pBVar8->name)._M_dataplus._M_p,
                     (pBVar8->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," differs from value set with glUniform*()",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          local_1cc = false;
        }
      }
      lVar9 = lVar9 + 1;
      pBVar10 = (basicUniforms->
                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x98;
      lVar7 = lVar7 + 0x44;
    } while (lVar9 < (int)((ulong)((long)(basicUniforms->
                                         super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10
                                  ) >> 3) * 0x286bca1b);
  }
  return local_1cc;
}

Assistant:

bool UniformCase::compareUniformValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

		if (!apiVarValueEquals(unifValue, uniform.finalValue))
		{
			log << TestLog::Message << "// FAILURE: value obtained with glGetUniform*() for uniform " << uniform.name << " differs from value set with glUniform*()" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}